

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O1

void __thiscall clipp::group::group<clipp::group>(group *this,group *p1,group *p2)

{
  (this->super_token<clipp::group>).doc_._M_dataplus._M_p =
       (pointer)&(this->super_token<clipp::group>).doc_.field_2;
  (this->super_token<clipp::group>).doc_._M_string_length = 0;
  (this->super_token<clipp::group>).doc_.field_2._M_local_buf[0] = '\0';
  (this->super_token<clipp::group>).repeatable_ = false;
  (this->super_token<clipp::group>).blocking_ = false;
  (this->children_).
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children_).
  super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->children_).
           super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->children_).
           super__Vector_base<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  this->scoped_ = true;
  push_back<clipp::group,clipp::group>(this,p1,p2);
  return;
}

Assistant:

explicit
    group(group p1, P2 p2, Ps... ps):
        children_{}, exclusive_{false}, joinable_{false}, scoped_{true}
    {
        push_back(std::move(p1), std::move(p2), std::move(ps)...);
    }